

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::GetNode
          (TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *this,
          PClassWeapon *key)

{
  TValueTraits<int> local_29;
  TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *pTStack_28;
  TValueTraits<int> traits;
  Node *n;
  PClassWeapon *key_local;
  TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *this_local;
  
  pTStack_28 = (TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *)
               FindKey(this,key);
  this_local = pTStack_28;
  if (pTStack_28 ==
      (TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *)0x0) {
    pTStack_28 = (TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_> *)
                 NewKey(this,key);
    TValueTraits<int>::Init(&local_29,(int *)&pTStack_28->Size);
    this_local = pTStack_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}